

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

SUNErrCode SUNMatZero_Dense(SUNMatrix A)

{
  long lVar1;
  sunrealtype *Adata;
  sunindextype i;
  SUNContext sunctx_local_scope_;
  SUNMatrix A_local;
  
  lVar1 = *(long *)((long)A->content + 0x10);
  for (i = 0; i < *(long *)((long)A->content + 0x18); i = i + 1) {
    *(undefined8 *)(lVar1 + i * 8) = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatZero_Dense(SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i;
  sunrealtype* Adata;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* Perform operation A_ij = 0 */
  Adata = SM_DATA_D(A);
  for (i = 0; i < SM_LDATA_D(A); i++) { Adata[i] = ZERO; }

  return SUN_SUCCESS;
}